

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall crnlib::dxt_hc::determine_color_endpoints(dxt_hc *this)

{
  uint *puVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  color_cluster *this_00;
  long lVar5;
  uint *puVar6;
  undefined4 *puVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  tile_details *ptVar11;
  color_cluster *pcVar12;
  color_quad_u8 (*pacVar13) [16];
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar14;
  undefined8 uVar15;
  pointer __first;
  pointer pNVar16;
  bool bVar17;
  executable_task *peVar18;
  endpoint_indices_details *peVar19;
  int iVar20;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar21;
  ulong uVar22;
  code *pcVar23;
  Node *extraout_RDX;
  Node *extraout_RDX_00;
  Node *__y;
  void *pvVar24;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  code *in_R8;
  _Iter_comp_val<std::less<Node>_> *in_R9;
  void *pvVar30;
  long lVar31;
  task_pool *ptVar32;
  ulong uVar33;
  uint64 uVar34;
  float fVar35;
  Node __value;
  vector<unsigned_int> weights;
  vector<Node>_conflict nodes;
  vector<crnlib::vec<6U,_float>_> vectors;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> endpoints;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> queue;
  tree_clusterizer<crnlib::vec<6U,_float>_> vq;
  color_quad_u8 mirror [16];
  vector<unsigned_int> local_1c8;
  elemental_vector local_1b8;
  vector<crnlib::vec<6U,_float>_> local_1a8;
  elemental_vector local_198;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_180;
  priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_> local_178;
  long local_150;
  ulong local_148;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_140;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *local_138;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *local_130;
  tree_clusterizer<crnlib::vec<6U,_float>_> local_128;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar9 = this->m_pTask_pool->m_num_threads;
  local_198.m_p = (void *)0x0;
  local_198.m_size = 0;
  local_198.m_capacity = 0;
  uVar26 = (this->m_tiles).m_size;
  uVar28 = 0;
  if (uVar26 == 0) {
    pvVar30 = (void *)0x0;
  }
  else {
    lVar27 = 0x14;
    pvVar30 = (void *)0x0;
    uVar33 = 0;
    do {
      ptVar11 = (this->m_tiles).m_p;
      uVar10 = *(uint *)((long)(ptVar11->color_endpoint).m_s + lVar27 + -0x20);
      if (uVar10 != 0) {
        fVar35 = (float)uVar10 * *(float *)((long)(&ptVar11->color_endpoint + -1) + lVar27);
        local_128.m_weightedVectors._8_8_ =
             *(undefined8 *)((long)(ptVar11->color_endpoint).m_s + lVar27 + -4);
        plVar3 = (long *)((long)(ptVar11->color_endpoint).m_s + lVar27 + -0x14);
        local_128.m_vectors = (vec<6U,_float> *)*plVar3;
        local_128.m_weightedVectors.m_p = (vec<6U,_float> *)plVar3[1];
        if (local_198.m_capacity <= uVar28) {
          local_180 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)CONCAT44(local_180._4_4_,fVar35)
          ;
          in_R8 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::object_mover;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          elemental_vector::increase_capacity
                    (&local_198,uVar28 + 1,true,0x1c,
                     vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::object_mover,false);
          uVar26 = (this->m_tiles).m_size;
          pvVar30 = local_198.m_p;
          fVar35 = local_180._0_4_;
          uVar28 = local_198.m_size;
        }
        lVar4 = (ulong)uVar28 * 0x1c;
        *(undefined8 *)((long)pvVar30 + lVar4 + 0x10) = local_128.m_weightedVectors._8_8_;
        puVar7 = (undefined4 *)((long)pvVar30 + lVar4);
        *puVar7 = local_128.m_vectors._0_4_;
        puVar7[1] = local_128.m_vectors._4_4_;
        puVar7[2] = local_128.m_weightedVectors.m_p._0_4_;
        puVar7[3] = local_128.m_weightedVectors.m_p._4_4_;
        *(int *)((long)pvVar30 + lVar4 + 0x18) = (int)(long)fVar35;
        uVar28 = uVar28 + 1;
        local_198.m_size = uVar28;
      }
      uVar33 = uVar33 + 1;
      lVar27 = lVar27 + 0x48;
    } while (uVar33 < uVar26);
  }
  local_1b8.m_p = (void *)0x0;
  local_1b8.m_size = 0;
  local_1b8.m_capacity = 0;
  uVar26 = uVar9 + 1;
  if (uVar26 != 0) {
    uVar28 = 0;
    iVar20 = 1;
    do {
      pvVar24 = (void *)(((ulong)(local_198.m_size * iVar20) / (ulong)uVar26) * 0x1c +
                        (long)local_198.m_p);
      if (pvVar30 != pvVar24) {
        if (local_1b8.m_capacity <= uVar28) {
          in_R8 = vector<Node>::object_mover;
          in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
          elemental_vector::increase_capacity
                    (&local_1b8,uVar28 + 1,true,0x10,vector<Node>::object_mover,false);
          uVar28 = local_1b8.m_size;
        }
        *(void **)((long)local_1b8.m_p + (ulong)uVar28 * 0x10) = pvVar30;
        *(void **)((long)local_1b8.m_p + (ulong)uVar28 * 0x10 + 8) = pvVar24;
        uVar28 = uVar28 + 1;
        local_1b8.m_size = uVar28;
      }
      iVar2 = iVar20 - uVar9;
      iVar20 = iVar20 + 1;
      pvVar30 = pvVar24;
    } while (iVar2 != 1);
    if (uVar28 != 0) {
      lVar27 = 0;
      uVar34 = 0;
      do {
        task_pool::queue_task
                  (this->m_pTask_pool,determine_color_endpoints::Node::sort_task,uVar34,
                   (void *)((long)local_1b8.m_p + lVar27));
        uVar34 = uVar34 + 1;
        lVar27 = lVar27 + 0x10;
      } while (uVar34 < (local_1b8._8_8_ & 0xffffffff));
    }
  }
  task_pool::join(this->m_pTask_pool);
  local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_1b8.m_size != 0) {
    lVar27 = 0;
    uVar33 = 0;
    do {
      std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                (&local_178,(value_type *)((long)local_1b8.m_p + lVar27));
      uVar33 = uVar33 + 1;
      lVar27 = lVar27 + 0x10;
    } while (uVar33 < (local_1b8._8_8_ & 0xffffffff));
  }
  local_1a8.m_p = (vec<6U,_float> *)0x0;
  local_1a8.m_size = 0;
  local_1a8.m_capacity = 0;
  local_1c8.m_p = (uint *)0x0;
  local_1c8.m_size = 0;
  local_1c8.m_capacity = 0;
  vector<crnlib::vec<6U,_float>_>::reserve(&local_1a8,local_198.m_size);
  vector<unsigned_int>::reserve(&local_1c8,local_198.m_size);
  __y = extraout_RDX;
  do {
    while( true ) {
      pNVar16 = local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_finish;
      __first = local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_128.m_node_index_map.m_values.m_p = (raw_node *)0x0;
        local_128.m_node_index_map.m_values.m_size = 0;
        local_128.m_node_index_map.m_values.m_capacity = 0;
        local_128.m_vectorComparison.m_p = (bool *)0x0;
        local_128.m_vectorComparison.m_size = 0;
        local_128.m_vectorComparison.m_capacity = 0;
        local_128.m_vectorsInfoRight.m_p = (VectorInfo *)0x0;
        local_128.m_vectorsInfoRight.m_size = 0;
        local_128.m_vectorsInfoRight.m_capacity = 0;
        local_128.m_vectorsInfoLeft.m_p = (VectorInfo *)0x0;
        local_128.m_vectorsInfoLeft.m_size = 0;
        local_128.m_vectorsInfoLeft.m_capacity = 0;
        local_128.m_vectorsInfo.m_p = (VectorInfo *)0x0;
        local_128.m_vectorsInfo.m_size = 0;
        local_128.m_vectorsInfo.m_capacity = 0;
        local_128.m_weightedDotProducts.m_p = (double *)0x0;
        local_128.m_weightedDotProducts.m_size = 0;
        local_128.m_weightedDotProducts.m_capacity = 0;
        local_128.m_weightedVectors.m_p = (vec<6U,_float> *)0x0;
        local_128.m_weightedVectors.m_size = 0;
        local_128.m_weightedVectors.m_capacity = 0;
        local_128.m_node_index_map.m_hash_shift = 0x20;
        local_128.m_node_index_map.m_num_valid = 0;
        local_128.m_node_index_map.m_grow_threshold = 0;
        local_128.m_nodes.m_p = (vq_node *)0x0;
        local_128.m_nodes.m_size = 0;
        local_128.m_nodes.m_capacity = 0;
        local_128.m_codebook.m_p = (vec<6U,_float> *)0x0;
        local_128.m_codebook.m_size = 0;
        local_128.m_codebook.m_capacity = 0;
        uVar26 = (this->m_params).m_color_endpoint_codebook_size;
        if (this->m_num_tiles < uVar26) {
          uVar26 = this->m_num_tiles;
        }
        tree_clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                  (&local_128,local_1a8.m_p,local_1c8.m_p,local_1a8.m_size,uVar26,true,
                   this->m_pTask_pool);
        uVar34 = 0;
        vector<crnlib::dxt_hc::color_cluster>::resize
                  (&this->m_color_clusters,local_128.m_codebook.m_size,false);
        ptVar32 = this->m_pTask_pool;
        do {
          peVar18 = (executable_task *)crnlib_malloc(0x28);
          peVar18->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d29c0;
          peVar18[1]._vptr_executable_task = (_func_int **)this;
          peVar18[2]._vptr_executable_task = (_func_int **)determine_color_endpoint_clusters_task;
          peVar18[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&peVar18[4]._vptr_executable_task = 1;
          task_pool::queue_task(ptVar32,peVar18,uVar34,&local_128);
          uVar26 = (int)uVar34 + 1;
          uVar34 = (uint64)uVar26;
          ptVar32 = this->m_pTask_pool;
        } while (uVar26 <= ptVar32->m_num_threads);
        task_pool::join(ptVar32);
        uVar26 = this->m_num_blocks;
        if (uVar26 != 0) {
          lVar27 = 0;
          uVar33 = 0;
          do {
            ptVar11 = (this->m_tiles).m_p;
            if (*(int *)((long)(ptVar11->color_endpoint).m_s + lVar27 + -0xc) != 0) {
              vector<crnlib::color_quad<unsigned_char,_int>_>::append
                        (&(this->m_color_clusters).m_p
                          [*(ushort *)((long)ptVar11->cluster_indices + lVar27)].pixels,
                         (vector<crnlib::color_quad<unsigned_char,_int>_> *)
                         ((long)(ptVar11->color_endpoint).m_s + lVar27 + -0x14));
              uVar26 = this->m_num_blocks;
            }
            uVar33 = uVar33 + 1;
            lVar27 = lVar27 + 0x48;
          } while (uVar33 < uVar26);
          if (uVar26 != 0) {
            uVar33 = 0;
            do {
              uVar8 = (this->m_tiles).m_p[(this->m_tile_indices).m_p[uVar33]].cluster_indices[0];
              (this->m_endpoint_indices).m_p[uVar33].field_0.field_0.color = uVar8;
              pcVar12 = (this->m_color_clusters).m_p;
              this_00 = pcVar12 + uVar8;
              uVar26 = pcVar12[uVar8].blocks[0].m_size;
              if (pcVar12[uVar8].blocks[0].m_capacity <= uVar26) {
                elemental_vector::increase_capacity
                          ((elemental_vector *)this_00,uVar26 + 1,true,4,(object_mover)0x0,false);
                uVar26 = this_00->blocks[0].m_size;
              }
              this_00->blocks[0].m_p[uVar26] = (uint)uVar33;
              puVar1 = &this_00->blocks[0].m_size;
              *puVar1 = *puVar1 + 1;
              if (this->m_has_subblocks == true) {
                peVar19 = (this->m_endpoint_indices).m_p;
                if ((peVar19[uVar33].reference != '\0') &&
                   (uVar8 == peVar19[(uint)uVar33 - 1].field_0.field_0.color)) {
                  if (peVar19[uVar33].reference != '\x01') {
                    pacVar13 = this->m_blocks;
                    uVar22 = uVar33 >> 1;
                    uVar26 = 0;
                    uVar29 = 0;
                    do {
                      *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
                       ((long)&local_78 + uVar29 * 4) =
                           pacVar13[uVar22][(uint)(uVar29 >> 2) & 0x3fffffff | uVar26 & 0xc].field_0
                      ;
                      uVar29 = uVar29 + 1;
                      uVar26 = uVar26 + 4;
                    } while (uVar29 != 0x10);
                    *(undefined8 *)(pacVar13[uVar22] + 0xc) = local_48;
                    *(undefined8 *)(pacVar13[uVar22] + 0xc + 2) = uStack_40;
                    *(undefined8 *)(pacVar13[uVar22] + 8) = local_58;
                    *(undefined8 *)(pacVar13[uVar22] + 8 + 2) = uStack_50;
                    *(undefined8 *)(pacVar13[uVar22] + 4) = local_68;
                    *(undefined8 *)(pacVar13[uVar22] + 4 + 2) = uStack_60;
                    *(undefined8 *)pacVar13[uVar22] = local_78;
                    *(undefined8 *)(pacVar13[uVar22] + 2) = uStack_70;
                    peVar19 = (this->m_endpoint_indices).m_p;
                  }
                  peVar19[uVar33].reference = '\0';
                }
              }
              uVar33 = uVar33 + 1;
            } while (uVar33 < this->m_num_blocks);
          }
        }
        ptVar32 = this->m_pTask_pool;
        uVar34 = 0;
        do {
          bVar17 = this->m_has_etc_color_blocks;
          peVar18 = (executable_task *)crnlib_malloc(0x28);
          pcVar23 = determine_color_endpoint_codebook_task;
          if (bVar17 != false) {
            pcVar23 = determine_color_endpoint_codebook_task_etc;
          }
          peVar18->_vptr_executable_task = (_func_int **)&PTR_execute_task_001d29c0;
          peVar18[1]._vptr_executable_task = (_func_int **)this;
          peVar18[2]._vptr_executable_task = (_func_int **)pcVar23;
          peVar18[3]._vptr_executable_task = (_func_int **)0x0;
          *(undefined4 *)&peVar18[4]._vptr_executable_task = 1;
          task_pool::queue_task(ptVar32,peVar18,uVar34,(void *)0x0);
          uVar26 = (int)uVar34 + 1;
          uVar34 = (uint64)uVar26;
          ptVar32 = this->m_pTask_pool;
        } while (uVar26 <= ptVar32->m_num_threads);
        task_pool::join(ptVar32);
        tree_clusterizer<crnlib::vec<6U,_float>_>::~tree_clusterizer(&local_128);
        if (local_1c8.m_p != (uint *)0x0) {
          crnlib_free(local_1c8.m_p);
        }
        if (local_1a8.m_p != (vec<6U,_float> *)0x0) {
          crnlib_free(local_1a8.m_p);
        }
        if (__first != (pointer)0x0) {
          operator_delete(__first);
        }
        if (local_1b8.m_p != (void *)0x0) {
          crnlib_free(local_1b8.m_p);
        }
        if (local_198.m_p != (void *)0x0) {
          crnlib_free(local_198.m_p);
        }
        return;
      }
      ppVar25 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)
                (local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                 super__Vector_impl_data._M_start)->p;
      local_128.m_weightedVectors.m_p =
           &(local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
             super__Vector_impl_data._M_start)->pEnd->first;
      local_128.m_vectors = (vec<6U,_float> *)(ppVar25[2].first.m_s + 1);
      ppVar21 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_128.m_vectors;
      if (0x10 < (long)local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                       super__Vector_impl_data._M_start) {
        local_138 = local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].p;
        local_140 = local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].pEnd;
        ppVar14 = (local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start)->pEnd;
        local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].p =
             (local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
              super__Vector_impl_data._M_start)->p;
        local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
        _M_finish[-1].pEnd = ppVar14;
        local_148 = (long)local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish +
                    (-0x10 - (long)local_178.c.super__Vector_base<Node,_std::allocator<Node>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        local_150 = (long)local_148 >> 4;
        local_180 = ppVar25;
        local_130 = (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_128.m_vectors;
        if (local_150 < 3) {
          lVar27 = 0;
        }
        else {
          lVar4 = local_150 - (local_150 + -1 >> 0x3f);
          lVar31 = 0;
          do {
            lVar5 = lVar31 * 2 + 2;
            lVar27 = lVar31 * 2 + 1;
            bVar17 = std::less<Node>::operator()
                               ((less<Node> *)((Node *)(__first + lVar5))->p,
                                (Node *)((Node *)(__first + lVar27))->p,__y);
            if (!bVar17) {
              lVar27 = lVar5;
            }
            ppVar25 = ((Node *)(__first + lVar27))->pEnd;
            ((Node *)(__first + lVar31))->p = ((Node *)(__first + lVar27))->p;
            ((Node *)(__first + lVar31))->pEnd = ppVar25;
            __y = extraout_RDX_00;
            lVar31 = lVar27;
          } while (lVar27 < lVar4 + -1 >> 1);
        }
        ppVar25 = local_180;
        if (((local_148 & 0x10) == 0) && (lVar27 == local_150 + -2 >> 1)) {
          lVar4 = lVar27 * 2 + 1;
          ppVar21 = ((Node *)(__first + lVar4))->pEnd;
          ((Node *)(__first + lVar27))->p = ((Node *)(__first + lVar4))->p;
          ((Node *)(__first + lVar27))->pEnd = ppVar21;
          lVar27 = lVar4;
        }
        __value.pEnd = (pair<crnlib::vec<6U,_float>,_unsigned_int> *)in_R8;
        __value.p = local_140;
        std::
        __push_heap<__gnu_cxx::__normal_iterator<crnlib::dxt_hc::determine_color_endpoints()::Node*,std::vector<crnlib::dxt_hc::determine_color_endpoints()::Node,std::allocator<crnlib::dxt_hc::determine_color_endpoints()::Node>>>,long,crnlib::dxt_hc::determine_color_endpoints()::Node,__gnu_cxx::__ops::_Iter_comp_val<std::less<crnlib::dxt_hc::determine_color_endpoints()::Node>>>
                  ((__normal_iterator<Node_*,_std::vector<Node,_std::allocator<Node>_>_>)__first,
                   lVar27,(long)local_138,__value,in_R9);
        ppVar21 = local_130;
      }
      local_178.c.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_finish = pNVar16 + -1;
      if (ppVar21 != (pair<crnlib::vec<2U,_float>,_unsigned_int> *)local_128.m_weightedVectors.m_p)
      {
        std::priority_queue<Node,_std::vector<Node,_std::allocator<Node>_>,_std::less<Node>_>::push
                  (&local_178,(value_type *)&local_128);
      }
      if (local_1a8.m_size != 0) break;
LAB_001795ab:
      if (local_1a8.m_capacity <= local_1a8.m_size) {
        in_R8 = (code *)0x0;
        in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_1a8,local_1a8.m_size + 1,true,0x18,(object_mover)0x0,
                   false);
      }
      *(undefined8 *)(local_1a8.m_p[local_1a8.m_size].m_s + 4) =
           *(undefined8 *)(ppVar25[1].first.m_s + 1);
      uVar15 = *(undefined8 *)&ppVar25->second;
      *(undefined8 *)local_1a8.m_p[local_1a8.m_size].m_s = *(undefined8 *)(ppVar25->first).m_s;
      *(undefined8 *)(local_1a8.m_p[local_1a8.m_size].m_s + 2) = uVar15;
      local_1a8.m_size = local_1a8.m_size + 1;
      if (local_1c8.m_capacity <= local_1c8.m_size) {
        in_R8 = (code *)0x0;
        in_R9 = (_Iter_comp_val<std::less<Node>_> *)0x0;
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_1c8,local_1c8.m_size + 1,true,4,(object_mover)0x0,
                   false);
      }
      fVar35 = ppVar25[2].first.m_s[0];
      __y = (Node *)(ulong)(uint)fVar35;
      local_1c8.m_p[local_1c8.m_size] = (uint)fVar35;
      local_1c8.m_size = local_1c8.m_size + 1;
    }
    fVar35 = (ppVar25->first).m_s[0];
    if ((fVar35 != local_1a8.m_p[local_1a8.m_size - 1].m_s[0]) ||
       (NAN(fVar35) || NAN(local_1a8.m_p[local_1a8.m_size - 1].m_s[0]))) goto LAB_001795ab;
    uVar33 = 0xffffffffffffffff;
    do {
      if (uVar33 == 4) goto LAB_00179667;
      puVar6 = (uint *)((long)(&ppVar25->first + 1) + uVar33 * 4);
      uVar22 = uVar33 + 1;
      lVar27 = uVar33 + 2;
    } while (((float)*puVar6 == local_1a8.m_p[local_1a8.m_size - 1].m_s[lVar27]) &&
            (uVar33 = uVar22,
            !NAN((float)*puVar6) && !NAN(local_1a8.m_p[local_1a8.m_size - 1].m_s[lVar27])));
    if (uVar22 < 5) goto LAB_001795ab;
LAB_00179667:
    uVar26 = local_1c8.m_size - 1;
    uVar28 = local_1c8.m_p[uVar26] + (int)ppVar25[2].first.m_s[0];
    __y = (Node *)(ulong)uVar28;
    if (CARRY4(local_1c8.m_p[uVar26],(uint)ppVar25[2].first.m_s[0])) {
      local_1c8.m_p[uVar26] = 0xffffffff;
    }
    else {
      local_1c8.m_p[uVar26] = uVar28;
    }
  } while( true );
}

Assistant:

void dxt_hc::determine_color_endpoints()
    {
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        crnlib::vector<std::pair<vec6F, uint>> endpoints;
        for (uint t = 0; t < m_tiles.size(); t++)
        {
            if (m_tiles[t].pixels.size())
            {
                endpoints.push_back(std::make_pair(m_tiles[t].color_endpoint, (uint)(m_tiles[t].pixels.size() * m_tiles[t].weight)));
            }
        }

        struct Node
        {
            std::pair<vec6F, uint>*p, *pEnd;
            Node(std::pair<vec6F, uint>* begin, std::pair<vec6F, uint>* end) :
                p(begin), pEnd(end)
            {
            }
            bool operator<(const Node& other) const
            {
                return *p > *other.p;
            }
            static void sort_task(uint64 data, void* ptr)
            {
                std::sort(((Node*)ptr)->p, ((Node*)ptr)->pEnd);
            }
        };

        crnlib::vector<Node> nodes;
        Node node(0, endpoints.get_ptr());
        for (uint i = 0; i < num_tasks; i++)
        {
            node.p = node.pEnd;
            node.pEnd = endpoints.get_ptr() + endpoints.size() * (i + 1) / num_tasks;
            if (node.p != node.pEnd)
            {
                nodes.push_back(node);
            }
        }

        for (uint i = 0; i < nodes.size(); i++)
        {
            m_pTask_pool->queue_task(&Node::sort_task, i, &nodes[i]);
        }
        m_pTask_pool->join();

        std::priority_queue<Node> queue;
        for (uint i = 0; i < nodes.size(); i++)
        {
            queue.push(nodes[i]);
        }

        crnlib::vector<vec6F> vectors;
        crnlib::vector<uint> weights;
        vectors.reserve(endpoints.size());
        weights.reserve(endpoints.size());
        while (queue.size())
        {
            Node node = queue.top();
            std::pair<vec6F, uint>* endpoint = node.p++;
            queue.pop();
            if(node.p != node.pEnd)
            {
                queue.push(node);
            }
            if (!vectors.size() || endpoint->first != vectors.back())
            {
                vectors.push_back(endpoint->first);
                weights.push_back(endpoint->second);
            }
            else if (weights.back() > UINT_MAX - endpoint->second)
            {
                weights.back() = UINT_MAX;
            }
            else
            {
                weights.back() += endpoint->second;
            }
        }

        tree_clusterizer<vec6F> vq;
        vq.generate_codebook(vectors.get_ptr(), weights.get_ptr(), vectors.size(), math::minimum<uint>(m_num_tiles, m_params.m_color_endpoint_codebook_size), true, m_pTask_pool);
        m_color_clusters.resize(vq.get_codebook_size());

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, &dxt_hc::determine_color_endpoint_clusters_task, i, &vq);
        }
        m_pTask_pool->join();

        for (uint t = 0; t < m_num_blocks; t++)
        {
            if (m_tiles[t].pixels.size())
            {
                m_color_clusters[m_tiles[t].cluster_indices[cColor]].pixels.append(m_tiles[t].pixels);
            }
        }

        for (uint b = 0; b < m_num_blocks; b++)
        {
            uint cluster_index = m_tiles[m_tile_indices[b]].cluster_indices[cColor];
            m_endpoint_indices[b].component[cColor] = cluster_index;
            m_color_clusters[cluster_index].blocks[cColor].push_back(b);
            if (m_has_subblocks && m_endpoint_indices[b].reference && cluster_index == m_endpoint_indices[b - 1].component[cColor])
            {
                if (m_endpoint_indices[b].reference >> 1)
                {
                    color_quad_u8 mirror[16];
                    for (uint p = 0; p < 16; p++)
                    {
                        mirror[p] = m_blocks[b >> 1][(p << 2 & 12) | p >> 2];
                    }
                    memcpy(m_blocks[b >> 1], mirror, 64);
                }
                m_endpoint_indices[b].reference = 0;
            }
        }

        for (uint i = 0; i <= m_pTask_pool->get_num_threads(); i++)
        {
            m_pTask_pool->queue_object_task(this, m_has_etc_color_blocks ? &dxt_hc::determine_color_endpoint_codebook_task_etc : &dxt_hc::determine_color_endpoint_codebook_task, i, nullptr);
        }
        m_pTask_pool->join();
    }